

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O0

void __thiscall QL_NodeRel::QL_NodeRel(QL_NodeRel *this,QL_Manager *qlm,RelCatEntry *rEntry)

{
  char *pcVar1;
  size_t sVar2;
  void *value;
  RelCatEntry *rEntry_local;
  QL_Manager *qlm_local;
  QL_NodeRel *this_local;
  
  QL_Node::QL_Node(&this->super_QL_Node,qlm);
  (this->super_QL_Node)._vptr_QL_Node = (_func_int **)&PTR_OpenIt_00147c50;
  RM_FileHandle::RM_FileHandle(&this->fh);
  IX_IndexHandle::IX_IndexHandle(&this->ih);
  RM_FileScan::RM_FileScan(&this->fs);
  IX_IndexScan::IX_IndexScan(&this->is);
  pcVar1 = (char *)malloc(0x19);
  this->relName = pcVar1;
  memset(this->relName,0,8);
  pcVar1 = this->relName;
  sVar2 = strlen(rEntry->relName);
  memcpy(pcVar1,rEntry,sVar2 + 1);
  this->relNameInitialized = true;
  (this->super_QL_Node).listsInitialized = false;
  (this->super_QL_Node).isOpen = false;
  (this->super_QL_Node).tupleLength = rEntry->tupleLength;
  this->useIndex = false;
  this->indexNo = 0;
  this->indexAttr = 0;
  (this->super_QL_Node).useIndexJoin = false;
  return;
}

Assistant:

QL_NodeRel::QL_NodeRel(QL_Manager &qlm, RelCatEntry *rEntry) : QL_Node(qlm){
  relName = (char *)malloc(MAXNAME+1);
  memset((void *)relName, 0, sizeof(relName));
  memcpy(this->relName, rEntry->relName, strlen(rEntry->relName) + 1);
  relNameInitialized = true;
  listsInitialized = false;

  isOpen = false;
  tupleLength = rEntry->tupleLength;

  useIndex = false;
  indexNo = 0;
  indexAttr = 0;
  void *value = NULL;
  useIndexJoin = false;
}